

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fld_move.c
# Opt level: O0

int move_field(FIELD *field,int frow,int fcol)

{
  int *piVar1;
  int fcol_local;
  int frow_local;
  FIELD *field_local;
  
  if (((field == (FIELD *)0x0) || (frow < 0)) || (fcol < 0)) {
    piVar1 = __errno_location();
    *piVar1 = -2;
    field_local._4_4_ = -2;
  }
  else if (field->form == (formnode *)0x0) {
    field->frow = (short)frow;
    field->fcol = (short)fcol;
    piVar1 = __errno_location();
    *piVar1 = 0;
    field_local._4_4_ = 0;
  }
  else {
    piVar1 = __errno_location();
    *piVar1 = -4;
    field_local._4_4_ = -4;
  }
  return field_local._4_4_;
}

Assistant:

int move_field(FIELD *field, int frow, int fcol)
{
  if ( !field || (frow<0) || (fcol<0) ) 
    RETURN(E_BAD_ARGUMENT);

  if (field->form) 
    RETURN(E_CONNECTED);

  field->frow = frow;
  field->fcol = fcol;
  RETURN(E_OK);
}